

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O1

void anon_unknown.dwarf_3e821::adjustTableSize(Module *wasm,int initialSize,bool secondary)

{
  pointer puVar1;
  Table *pTVar2;
  ulong uVar3;
  undefined1 local_198 [392];
  
  if (initialSize < 0) {
    return;
  }
  puVar1 = (wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar1 == (wasm->tables).
                super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    if (secondary) {
      return;
    }
    ::wasm::Fatal::Fatal((Fatal *)local_198);
    ::wasm::Fatal::operator<<
              ((Fatal *)local_198,(char (*) [43])"--initial-table used but there is no table");
  }
  else {
    uVar3 = (ulong)(uint)initialSize;
    pTVar2 = (puVar1->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
             super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    if (uVar3 < (pTVar2->initial).addr) {
      ::wasm::Fatal::Fatal((Fatal *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_198 + 0x10),
                 "Specified initial table size too small, should be at least ",0x3b);
      ::wasm::Fatal::operator<<
                ((Fatal *)local_198,
                 &((puVar1->_M_t).
                   super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                   super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->initial);
    }
    else {
      if (uVar3 <= (pTVar2->max).addr) {
        (pTVar2->initial).addr = uVar3;
        return;
      }
      ::wasm::Fatal::Fatal((Fatal *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_198 + 0x10),
                 "Specified initial table size larger than max table size ",0x38);
      ::wasm::Fatal::operator<<
                ((Fatal *)local_198,
                 &((puVar1->_M_t).
                   super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                   super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->max);
    }
  }
  ::wasm::Fatal::~Fatal((Fatal *)local_198);
}

Assistant:

void adjustTableSize(Module& wasm, int initialSize, bool secondary = false) {
  if (initialSize < 0) {
    return;
  }
  if (wasm.tables.empty()) {
    if (secondary) {
      // It's not a problem if the table is not used in the secondary module.
      return;
    }
    Fatal() << "--initial-table used but there is no table";
  }

  auto& table = wasm.tables.front();

  if ((uint64_t)initialSize < table->initial) {
    Fatal() << "Specified initial table size too small, should be at least "
            << table->initial;
  }
  if ((uint64_t)initialSize > table->max) {
    Fatal() << "Specified initial table size larger than max table size "
            << table->max;
  }
  table->initial = initialSize;
}